

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O2

void Imf_2_5::copyFromFrameBuffer
               (char **writePtr,char **readPtr,char *endPtr,size_t xStride,Format format,
               PixelType type)

{
  char *pcVar1;
  ArgExc *this;
  long lVar2;
  float *pfVar3;
  char *local_38;
  
  pcVar1 = *writePtr;
  pfVar3 = (float *)*readPtr;
  local_38 = pcVar1;
  if (format == XDR) {
    if (type == UINT) {
      for (; pfVar3 <= endPtr; pfVar3 = (float *)((long)pfVar3 + xStride)) {
        Xdr::write<Imf_2_5::CharPtrIO,char*>(&local_38,(uint)*pfVar3);
      }
    }
    else if (type == HALF) {
      for (; pfVar3 <= endPtr; pfVar3 = (float *)((long)pfVar3 + xStride)) {
        Xdr::write<Imf_2_5::CharPtrIO,char*>(&local_38,(half)*(unsigned_short *)pfVar3);
      }
    }
    else {
      if (type != FLOAT) {
LAB_00541e93:
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this,"Unknown pixel data type.");
        __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      for (; pfVar3 <= endPtr; pfVar3 = (float *)((long)pfVar3 + xStride)) {
        Xdr::write<Imf_2_5::CharPtrIO,char*>(&local_38,*pfVar3);
      }
    }
  }
  else if (type == UINT) {
    for (; pfVar3 <= endPtr; pfVar3 = (float *)((long)pfVar3 + xStride)) {
      for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
        local_38 = pcVar1 + 1;
        *pcVar1 = *(char *)((long)pfVar3 + lVar2);
        pcVar1 = local_38;
      }
    }
  }
  else if (type == HALF) {
    for (; local_38 = pcVar1, pfVar3 <= endPtr; pfVar3 = (float *)((long)pfVar3 + xStride)) {
      *(undefined2 *)pcVar1 = *(undefined2 *)pfVar3;
      pcVar1 = pcVar1 + 2;
    }
  }
  else {
    if (type != FLOAT) goto LAB_00541e93;
    for (; pfVar3 <= endPtr; pfVar3 = (float *)((long)pfVar3 + xStride)) {
      for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
        local_38 = pcVar1 + 1;
        *pcVar1 = *(char *)((long)pfVar3 + lVar2);
        pcVar1 = local_38;
      }
    }
  }
  *writePtr = local_38;
  *readPtr = (char *)pfVar3;
  return;
}

Assistant:

void
copyFromFrameBuffer (char *& writePtr,
		     const char *& readPtr,
                     const char * endPtr,
		     size_t xStride,
                     Compressor::Format format,
		     PixelType type)
{
    char * localWritePtr = writePtr;
    const char * localReadPtr = readPtr;
    //
    // Copy a horizontal row of pixels from a frame
    // buffer to an output file's line or tile buffer.
    //

    if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            while (localReadPtr <= endPtr)
            {
                Xdr::write <CharPtrIO> (localWritePtr,
                                        *(const unsigned int *) localReadPtr);
                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            while (localReadPtr <= endPtr)
            {
                Xdr::write <CharPtrIO> (localWritePtr, *(const half *) localReadPtr);
                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            while (localReadPtr <= endPtr)
            {
                Xdr::write <CharPtrIO> (localWritePtr, *(const float *) localReadPtr);
                localReadPtr += xStride;
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            while (localReadPtr <= endPtr)
            {
                for (size_t i = 0; i < sizeof (unsigned int); ++i)
                    *localWritePtr++ = localReadPtr[i];

                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            while (localReadPtr <= endPtr)
            {
                *(half *) localWritePtr = *(const half *) localReadPtr;
                localWritePtr += sizeof (half);
                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            while (localReadPtr <= endPtr)
            {
                for (size_t i = 0; i < sizeof (float); ++i)
                    *localWritePtr++ = localReadPtr[i];

                localReadPtr += xStride;
            }
            break;
            
          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }

    writePtr = localWritePtr;
    readPtr = localReadPtr;
}